

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int __thiscall AActor::GetModifiedDamage(AActor *this,FName *damagetype,int damage,bool passive)

{
  uint uVar1;
  bool bVar2;
  AInventory *pAVar3;
  FName local_24;
  byte local_1d;
  uint local_1c;
  bool passive_local;
  FName *pFStack_18;
  int damage_local;
  FName *damagetype_local;
  AActor *this_local;
  
  local_1d = passive;
  local_1c = damage;
  pFStack_18 = damagetype;
  damagetype_local = (FName *)this;
  bVar2 = TObjPtr<AInventory>::operator!=(&this->Inventory,(AInventory *)0x0);
  if (bVar2) {
    pAVar3 = TObjPtr<AInventory>::operator->(&this->Inventory);
    uVar1 = local_1c;
    FName::FName(&local_24,damagetype);
    (*(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2c])
              (pAVar3,(ulong)uVar1,&local_24,&local_1c,(ulong)(local_1d & 1));
  }
  return local_1c;
}

Assistant:

int AActor::GetModifiedDamage(FName damagetype, int damage, bool passive)
{
	if (Inventory != nullptr)
		Inventory->ModifyDamage(damage, damagetype, damage, passive);

	return damage;
}